

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sturm.cpp
# Opt level: O0

void __thiscall opengv::math::Sturm::Sturm(Sturm *this,vector<double,_std::allocator<double>_> *p)

{
  Index IVar1;
  const_reference pvVar2;
  Scalar *pSVar3;
  vector<double,_std::allocator<double>_> *in_RSI;
  undefined8 *in_RDI;
  undefined1 auVar4 [16];
  undefined1 in_ZMM1 [64];
  MatrixXd r;
  MatrixXd p2;
  MatrixXd *in_stack_00000148;
  MatrixXd p1;
  size_t i_2;
  size_t i_1;
  size_t i;
  EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
  *in_stack_fffffffffffffe38;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *in_stack_fffffffffffffe40;
  unsigned_long *in_stack_fffffffffffffe50;
  unsigned_long *in_stack_fffffffffffffe58;
  double *pdVar5;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_fffffffffffffe60;
  undefined8 *puVar6;
  Index in_stack_fffffffffffffe78;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffe80;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  
  *in_RDI = &PTR__Sturm_01483c58;
  puVar6 = in_RDI + 1;
  std::vector<double,_std::allocator<double>_>::size(in_RSI);
  std::vector<double,_std::allocator<double>_>::size(in_RSI);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_long,unsigned_long>
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x12b7c49);
  in_RDI[4] = IVar1;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_long,unsigned_long>
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffe40,
             (Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffe38);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x12b7c91);
  for (local_50 = 0; local_50 < (ulong)in_RDI[4]; local_50 = local_50 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,local_50);
    pdVar5 = (double *)*pvVar2;
    in_stack_fffffffffffffe60 =
         (Matrix<double,__1,__1,_0,__1,__1> *)
         Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                   (in_stack_fffffffffffffe40,(Index)in_stack_fffffffffffffe38,0x12b7ce9);
    (in_stack_fffffffffffffe60->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
    m_storage.m_data = pdVar5;
  }
  for (local_58 = 1; auVar4 = in_ZMM1._0_16_, local_58 < (ulong)in_RDI[4]; local_58 = local_58 + 1)
  {
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       (in_stack_fffffffffffffe40,(Index)in_stack_fffffffffffffe38,0x12b7d6e);
    auVar4 = vcvtusi2sd_avx512f(auVar4,in_RDI[4] - local_58);
    in_ZMM1 = ZEXT1664(auVar4);
    in_stack_fffffffffffffe40 =
         (DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)(*pSVar3 * auVar4._0_8_);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       (in_stack_fffffffffffffe40,(Index)in_stack_fffffffffffffe38,0x12b7db0);
    *pSVar3 = (Scalar)in_stack_fffffffffffffe40;
  }
  for (local_60 = 2; local_60 < (ulong)in_RDI[4]; local_60 = local_60 + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,unsigned_long>
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,(Index)in_RDI,
               (int)((ulong)puVar6 >> 0x20),(unsigned_long)in_stack_fffffffffffffe60);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>
              ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffe40,
               in_stack_fffffffffffffe38);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,unsigned_long>
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,(Index)in_RDI,
               (int)((ulong)puVar6 >> 0x20),(unsigned_long)in_stack_fffffffffffffe60);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>
              ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffe40,
               in_stack_fffffffffffffe38);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x12b7eaa)
    ;
    computeNegatedRemainder
              ((Sturm *)p1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols,
               (MatrixXd *)
               p1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows,
               (MatrixXd *)
               p1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data,
               in_stack_00000148);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,unsigned_long>
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,(Index)in_RDI,
               (int)((ulong)puVar6 >> 0x20),(unsigned_long)in_stack_fffffffffffffe60);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,unsigned_long>
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,(Index)in_RDI,
               (int)((ulong)puVar6 >> 0x20),(unsigned_long)in_stack_fffffffffffffe60);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::operator=
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
               in_stack_fffffffffffffe40,
               (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
               in_stack_fffffffffffffe38);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)0x12b7f55);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)0x12b7f62);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)0x12b7f6f);
  }
  return;
}

Assistant:

opengv::math::Sturm::Sturm( const std::vector<double> & p ) :
    _C(Eigen::MatrixXd(p.size(),p.size()))
{
  _dimension = (size_t) _C.cols();
  _C = Eigen::MatrixXd(_dimension,_dimension);

  for( size_t i = 0; i < _dimension; i++ )
    _C(0,i) = p[i];

  for( size_t i = 1; i < _dimension; i++ )
    _C(1,i) = _C(0,i-1) * (_dimension-i);

  for( size_t i = 2; i < _dimension; i++ )
  {
    Eigen::MatrixXd p1 = _C.block(i-2,i-2,1,_dimension-(i-2));
    Eigen::MatrixXd p2 = _C.block(i-1,i-1,1,_dimension-(i-1));
    Eigen::MatrixXd r;
    computeNegatedRemainder(p1,p2,r);
    _C.block(i,i,1,_dimension-i) = r.block(0,2,1,_dimension-i);
  }
}